

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O0

int ipc_dialer_set_test_no_connect(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool local_31;
  void *pvStack_30;
  _Bool no_connect;
  ipc_dialer *d;
  size_t sStack_20;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  local_31 = false;
  pvStack_30 = arg;
  d._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  nni_copyin_bool(&local_31,buf,sz,t);
  nni_mtx_lock((nni_mtx *)((long)pvStack_30 + 0x60));
  *(byte *)((long)pvStack_30 + 0x128) = local_31 & 1;
  nni_mtx_unlock((nni_mtx *)((long)pvStack_30 + 0x60));
  return 0;
}

Assistant:

static int
ipc_dialer_set_test_no_connect(
    void *arg, const void *buf, size_t sz, nni_type t)
{
	ipc_dialer *d          = arg;
	bool        no_connect = false;

	(void) nni_copyin_bool(&no_connect, buf, sz, t);
	nni_mtx_lock(&d->mtx);
	d->no_connect = no_connect;
	nni_mtx_unlock(&d->mtx);
	return (0);
}